

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.h
# Opt level: O0

void __thiscall
Assimp::FBX::Node::AddProperties<std::__cxx11::string,std::__cxx11::string,long>
          (Node *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *more,long more_1)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  long local_28;
  long more_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *more_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  Node *this_local;
  
  local_28 = more_1;
  more_local_1 = (long)more;
  more_local = value;
  value_local = &this->name;
  std::vector<Assimp::FBX::FBXExportProperty,std::allocator<Assimp::FBX::FBXExportProperty>>::
  emplace_back<std::__cxx11::string&>
            ((vector<Assimp::FBX::FBXExportProperty,std::allocator<Assimp::FBX::FBXExportProperty>>
              *)&this->properties,value);
  std::__cxx11::string::string((string *)&local_48,(string *)more);
  AddProperties<std::__cxx11::string,long>(this,&local_48,local_28);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void AddProperties(T value, More... more) {
        properties.emplace_back(value);
        AddProperties(more...);
    }